

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp,REF_INT node)

{
  int iVar1;
  int iVar2;
  REF_MPI pRVar3;
  REF_INT *pRVar4;
  REF_AGENTS ref_agents;
  REF_AGENT_STRUCT *pRVar5;
  REF_CELL pRVar6;
  REF_NODE pRVar7;
  uint uVar8;
  REF_INT *pRVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  REF_DBL *pRVar14;
  long lStackY_60;
  REF_INT id;
  REF_DBL *local_48;
  REF_LIST ref_list;
  REF_NODE local_38;
  
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x74f,
           "ref_interp_locate_node","ref_interp NULL");
    return 2;
  }
  if (ref_interp->max < node) {
    pcVar12 = "more nodes added, should move only";
    uVar10 = 0x752;
    goto LAB_0012fe38;
  }
  pRVar9 = ref_interp->cell;
  if (pRVar9[node] == -1) {
    return 0;
  }
  pRVar3 = ref_interp->ref_mpi;
  pRVar4 = ref_interp->part;
  if (pRVar3->id != pRVar4[node]) {
    return 0;
  }
  ref_agents = ref_interp->ref_agents;
  uVar11 = (ulong)ref_agents->n;
  if (uVar11 != 0) {
    pcVar12 = "did not expect active agents";
    uVar10 = 0x75b;
    lStackY_60 = 0;
LAB_0012fed7:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar10
           ,"ref_interp_locate_node",pcVar12,lStackY_60,uVar11);
    return 1;
  }
  local_38 = ref_interp->to_grid->node;
  ref_interp->agent_hired[node] = 1;
  pRVar14 = (REF_DBL *)((long)(node * 0xf) * 8);
  uVar8 = ref_agents_push(ref_agents,node,pRVar4[node],pRVar9[node],local_38->real + node * 0xf,&id)
  ;
  if (uVar8 == 0) {
    uVar11 = (ulong)ref_agents->agent[id].mode;
    local_48 = pRVar14;
    if (uVar11 != 1) {
      pcVar12 = "should be walking";
      lStackY_60 = 1;
      uVar10 = 0x762;
      goto LAB_0012fed7;
    }
    uVar8 = ref_interp_walk_agent(ref_interp,id);
    if (uVar8 == 0) {
      pRVar5 = ref_agents->agent;
      if (pRVar5[id].mode == REF_AGENT_ENCLOSING) {
        pRVar9 = ref_interp->cell;
        pRVar9[node] = pRVar5[id].seed;
        pRVar4 = ref_interp->part;
        pRVar4[node] = pRVar5[id].part;
        pRVar14 = ref_interp->bary;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          pRVar14[node * 4 + lVar13] = pRVar5[id].bary[lVar13];
        }
        ref_interp->walk_steps = pRVar5[id].step + ref_interp->walk_steps + 1;
        ref_interp->n_walk = ref_interp->n_walk + 1;
        iVar1 = pRVar3->id;
        lStackY_60 = (long)iVar1;
        iVar2 = pRVar4[node];
        uVar11 = (ulong)iVar2;
        if (iVar1 != iVar2) {
          pcVar12 = "expected local";
          uVar10 = 0x76b;
          goto LAB_0012fed7;
        }
        iVar1 = pRVar9[node];
        if (ref_interp->from_grid->twod == 0) {
          if (((iVar1 < 0) || (pRVar6 = ref_interp->from_tet, pRVar6->max <= iVar1)) ||
             (pRVar6->c2n[(long)pRVar6->size_per * (long)iVar1] == -1)) {
            pcVar12 = "expected a valid tet";
            uVar10 = 0x773;
            goto LAB_0012fe38;
          }
        }
        else if (((iVar1 < 0) || (pRVar6 = ref_interp->from_tri, pRVar6->max <= iVar1)) ||
                (pRVar6->c2n[(long)pRVar6->size_per * (long)iVar1] == -1)) {
          pcVar12 = "expected a valid tri";
          uVar10 = 0x76f;
LAB_0012fe38:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar10,"ref_interp_locate_node",pcVar12);
          return 1;
        }
      }
      else {
        ref_interp->cell[node] = -1;
      }
      ref_interp->agent_hired[node] = 0;
      uVar8 = ref_agents_remove(ref_agents,id);
      pRVar7 = local_38;
      if (uVar8 == 0) {
        pRVar9 = ref_interp->cell;
        if ((1 < local_38->ref_mpi->n) || (pRVar9[node] != -1)) {
LAB_00130158:
          return (uint)(pRVar9[node] == -1) * 5;
        }
        uVar8 = ref_list_create(&ref_list);
        if (uVar8 == 0) {
          uVar8 = ref_search_touching(ref_interp->ref_search,ref_list,
                                      (REF_DBL *)((long)pRVar7->real + (long)local_48),
                                      ref_interp->search_fuzz);
          if (uVar8 == 0) {
            if (0 < ref_list->n) {
              local_48 = (REF_DBL *)((long)local_48 + (long)local_38->real);
              if (ref_interp->from_grid->twod == 0) {
                uVar8 = ref_interp_enclosing_tet_in_list
                                  (ref_interp,ref_list,local_48,ref_interp->cell + node,
                                   ref_interp->bary + node * 4);
                if (uVar8 != 0) {
                  uVar11 = (ulong)uVar8;
                  pcVar12 = "best tet in list";
                  uVar10 = 0x790;
                  goto LAB_0012ff4d;
                }
              }
              else {
                uVar8 = ref_interp_enclosing_tri_in_list
                                  (ref_interp,ref_list,local_48,ref_interp->cell + node,
                                   ref_interp->bary + node * 4);
                if (uVar8 != 0) {
                  uVar11 = (ulong)uVar8;
                  pcVar12 = "best tri in list";
                  uVar10 = 0x78b;
                  goto LAB_0012ff4d;
                }
              }
            }
            uVar8 = ref_list_free(ref_list);
            if (uVar8 == 0) {
              pRVar9 = ref_interp->cell;
              goto LAB_00130158;
            }
            uVar11 = (ulong)uVar8;
            pcVar12 = "free list";
            uVar10 = 0x793;
          }
          else {
            uVar11 = (ulong)uVar8;
            pcVar12 = "tch";
            uVar10 = 0x785;
          }
        }
        else {
          uVar11 = (ulong)uVar8;
          pcVar12 = "create list";
          uVar10 = 0x781;
        }
      }
      else {
        uVar11 = (ulong)uVar8;
        pcVar12 = "no longer needed";
        uVar10 = 0x77b;
      }
    }
    else {
      uVar11 = (ulong)uVar8;
      pcVar12 = "walking";
      uVar10 = 0x763;
    }
  }
  else {
    uVar11 = (ulong)uVar8;
    pcVar12 = "requeue";
    uVar10 = 0x761;
  }
LAB_0012ff4d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar10,
         "ref_interp_locate_node",uVar11,pcVar12);
  return (REF_STATUS)uVar11;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");
  ref_mpi = ref_interp_mpi(ref_interp);

  RAS(node <= ref_interp_max(ref_interp), "more nodes added, should move only");

  /* no starting guess, skip */
  if (REF_EMPTY == ref_interp->cell[node] ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;

  ref_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  ref_interp->agent_hired[node] = REF_TRUE;
  RSS(ref_agents_push(ref_agents, node, ref_interp->part[node],
                      ref_interp->cell[node], ref_node_xyz_ptr(ref_node, node),
                      &id),
      "requeue");
  REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "should be walking");
  RSS(ref_interp_walk_agent(ref_interp, id), "walking");
  if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
    ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
    ref_interp->part[node] = ref_agent_part(ref_agents, id);
    for (i = 0; i < 4; i++)
      ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
    (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
    (ref_interp->n_walk)++;
    REIS(ref_mpi_rank(ref_mpi), ref_interp->part[node], "expected local");
    if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
      RAS(ref_cell_valid(ref_interp_from_tri(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tri");
    } else {
      RAS(ref_cell_valid(ref_interp_from_tet(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tet");
    }
  } else {
    /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
    /* what for parallel REF_AGENT_HOP_PART */
    ref_interp->cell[node] = REF_EMPTY;
  }
  ref_interp->agent_hired[node] = REF_FALSE; /* dismissed */
  RSS(ref_agents_remove(ref_agents, id), "no longer needed");

  if (!ref_mpi_para(ref_node_mpi(ref_node)) &&
      REF_EMPTY == ref_interp->cell[node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tri in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tet in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_EMPTY == ref_interp->cell[node]) {
    return REF_NOT_FOUND;
  }
  return REF_SUCCESS;
}